

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O3

void __thiscall
TPZFileEqnStorage<std::complex<long_double>_>::ReadBlockPositions
          (TPZFileEqnStorage<std::complex<long_double>_> *this)

{
  long in_RAX;
  ostream *poVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int64_t nextpos;
  long local_38;
  
  local_38 = in_RAX;
  TPZManVector<long,_10>::Resize
            (&(this->fBlockPos).super_TPZManVector<long,_10>,
             ((long)this->fNumHeaders + -1) * (long)this->fNumBlocks);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reading Block Positions\n",0x18);
  std::ostream::flush();
  if (0 < this->fNumBlocks) {
    iVar2 = 0;
    iVar3 = 0;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*",1);
      std::ostream::flush();
      if ((int)(uVar5 / 0x14) * 0x14 == (int)uVar5) {
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar2 / this->fNumBlocks);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"% Read\n",7);
        std::ostream::flush();
      }
      fread((this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore + iVar3,8,
            (long)this->fNumHeaders - 1,(FILE *)this->fIOStream);
      __n = (long)this->fNumHeaders - 1;
      iVar3 = iVar3 + (int)__n;
      fread(&local_38,8,__n,(FILE *)this->fIOStream);
      fseek((FILE *)this->fIOStream,local_38,0);
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      iVar2 = iVar2 + 100;
    } while ((int)uVar4 < this->fNumBlocks);
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::ReadBlockPositions()
{
#ifdef PZ_LOG
	if(logger.isDebugEnabled() ) LOGPZ_DEBUG(logger,"Reading block positions")
#endif
	int aux = fNumBlocks * (fNumHeaders-1);
	fBlockPos.Resize(aux);
	int i, ibl = 0;
	cout << "Reading Block Positions\n";
	cout.flush();
	int64_t sizereturn;
	sizereturn = 0;
	for(i=0;i<fNumBlocks;i++) {
		cout << "*";
		cout.flush();
		if(!(i%20)){
			cout << 100*i/fNumBlocks << "% Read\n";
			cout.flush();
		}
		sizereturn = fread(&fBlockPos[ibl],sizeof(int64_t),fNumHeaders-1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != fNumHeaders-1) DebugStop();
#endif
		ibl+=fNumHeaders-1;
		int64_t nextpos;
		sizereturn = fread(&nextpos,sizeof(int64_t),fNumHeaders-1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != fNumHeaders-1) DebugStop();
#endif
		fseek(fIOStream,nextpos,SEEK_SET);
	}
}